

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Extractor::input(Extractor *this,char *blob_name,Mat *in)

{
  FILE *__stream;
  int iVar1;
  vector<const_char_*,_std::allocator<const_char_*>_> *this_00;
  size_type sVar2;
  const_reference ppcVar3;
  char *in_RDI;
  size_t i;
  vector<const_char_*,_std::allocator<const_char_*>_> *input_names;
  int blob_index;
  Mat *in_stack_ffffffffffffffb8;
  Net *in_stack_ffffffffffffffc8;
  ulong uVar4;
  ulong __n;
  int local_4;
  
  iVar1 = Net::find_blob_index_by_name(in_stack_ffffffffffffffc8,in_RDI);
  if (iVar1 == -1) {
    fprintf(_stderr,"Try");
    fprintf(_stderr,"\n");
    this_00 = Net::input_names((Net *)**(undefined8 **)(in_RDI + 8));
    uVar4 = 0;
    while( true ) {
      __n = uVar4;
      sVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(this_00);
      __stream = _stderr;
      if (sVar2 <= uVar4) break;
      ppcVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](this_00,__n);
      fprintf(__stream,"    ex.input(\"%s\", in%d);",*ppcVar3,__n & 0xffffffff);
      fprintf(_stderr,"\n");
      uVar4 = __n + 1;
    }
    local_4 = -1;
  }
  else {
    local_4 = input((Extractor *)in_stack_ffffffffffffffc8,(int)((ulong)in_RDI >> 0x20),
                    in_stack_ffffffffffffffb8);
  }
  return local_4;
}

Assistant:

int Extractor::input(const char* blob_name, const Mat& in)
{
    int blob_index = d->net->find_blob_index_by_name(blob_name);
    if (blob_index == -1)
    {
        NCNN_LOGE("Try");
        const std::vector<const char*>& input_names = d->net->input_names();
        for (size_t i = 0; i < input_names.size(); i++)
        {
            NCNN_LOGE("    ex.input(\"%s\", in%d);", input_names[i], (int)i);
        }

        return -1;
    }

    return input(blob_index, in);
}